

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float64_to_float128_mipsel(float64 a,float_status *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float128 fVar9;
  float128 fVar10;
  
  if ((status->flush_inputs_to_zero != '\0') &&
     ((a & 0xfffffffffffff) != 0 && (a & 0x7ff0000000000000) == 0)) {
    a = a & 0x8000000000000000;
    status->float_exception_flags = status->float_exception_flags | 0x40;
  }
  uVar4 = a & 0xfffffffffffff;
  uVar8 = a & 0x8000000000000000;
  uVar7 = (uint)(a >> 0x20);
  uVar6 = uVar7 >> 0x14 & 0x7ff;
  if (uVar6 == 0) {
    if (uVar4 == 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      return (float128)(auVar3 << 0x40);
    }
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar7 = ((uint)lVar1 ^ 0x3f) + 0xf5;
    uVar4 = uVar4 << ((byte)uVar7 & 0x3f);
    uVar6 = -(uVar7 & 0xff);
LAB_007c5300:
    fVar9.low = uVar4 << 0x3c;
    fVar9.high = (uVar4 >> 4 | uVar8) + ((ulong)(uVar6 + 0x3c00) << 0x30);
    return fVar9;
  }
  if (uVar6 != 0x7ff) goto LAB_007c5300;
  if (uVar4 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = a | 0x7fff000000000000;
    return (float128)(auVar2 << 0x40);
  }
  if (status->snan_bit_is_one == '\0') {
    if ((a & 0x7ffffffffffff) == 0 || (a & 0x7ff8000000000000) != 0x7ff0000000000000)
    goto LAB_007c52b7;
  }
  else if ((uVar7 >> 0x13 & 0xfff) < 0xfff) goto LAB_007c52b7;
  status->float_exception_flags = status->float_exception_flags | 1;
LAB_007c52b7:
  if (status->default_nan_mode == '\0') {
    uVar5 = a << 0x3c;
    uVar8 = uVar8 | a >> 4 & 0xffffffffffff;
  }
  else {
    uVar8 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar8 = 0x1fffffffffffffff;
    }
    uVar5 = -(ulong)((uint)uVar8 & 1);
    uVar8 = uVar8 >> 0xe;
  }
  fVar10.high = uVar8 | 0x7fff000000000000;
  fVar10.low = uVar5;
  return fVar10;
}

Assistant:

float128 float64_to_float128(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloat128(float64ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    shift128Right( aSig, 0, 4, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp + 0x3C00, zSig0, zSig1 );

}